

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedate.c
# Opt level: O0

int checktz(char *check)

{
  bool bVar1;
  int iVar2;
  int local_28;
  tzinfo *ptStack_20;
  _Bool found;
  tzinfo *what;
  uint i;
  char *check_local;
  
  bVar1 = false;
  ptStack_20 = tz;
  what._4_4_ = 0;
  do {
    if (0x44 < what._4_4_) {
LAB_007802ca:
      if (bVar1) {
        local_28 = ptStack_20->offset * 0x3c;
      }
      else {
        local_28 = -1;
      }
      return local_28;
    }
    iVar2 = Curl_strcasecompare(check,ptStack_20->name);
    if (iVar2 != 0) {
      bVar1 = true;
      goto LAB_007802ca;
    }
    ptStack_20 = ptStack_20 + 1;
    what._4_4_ = what._4_4_ + 1;
  } while( true );
}

Assistant:

static int checktz(const char *check)
{
  unsigned int i;
  const struct tzinfo *what;
  bool found = FALSE;

  what = tz;
  for(i = 0; i< sizeof(tz)/sizeof(tz[0]); i++) {
    if(strcasecompare(check, what->name)) {
      found = TRUE;
      break;
    }
    what++;
  }
  return found?what->offset*60:-1;
}